

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation.h
# Opt level: O3

int64_t icu_63::Collation::ceFromCE32(uint32_t ce32)

{
  ulong uVar1;
  
  if ((ce32 & 0xff) < 0xc0) {
    return (ulong)((ce32 & 0xff) << 8) | CONCAT44(ce32,ce32 << 0x10) & 0xffff0000ff000000;
  }
  uVar1 = (ulong)(ce32 & 0xffffff00);
  if ((ce32 & 0xf) == 1) {
    uVar1 = uVar1 << 0x20 | 0x5000500;
  }
  return uVar1;
}

Assistant:

static inline int64_t ceFromCE32(uint32_t ce32) {
        uint32_t tertiary = ce32 & 0xff;
        if(tertiary < SPECIAL_CE32_LOW_BYTE) {
            // normal form ppppsstt -> pppp0000ss00tt00
            return ((int64_t)(ce32 & 0xffff0000) << 32) | ((ce32 & 0xff00) << 16) | (tertiary << 8);
        } else {
            ce32 -= tertiary;
            if((tertiary & 0xf) == LONG_PRIMARY_TAG) {
                // long-primary form ppppppC1 -> pppppp00050000500
                return ((int64_t)ce32 << 32) | COMMON_SEC_AND_TER_CE;
            } else {
                // long-secondary form ssssttC2 -> 00000000sssstt00
                // assert (tertiary & 0xf) == LONG_SECONDARY_TAG
                return ce32;
            }
        }
    }